

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCallRef
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,CallRef *curr)

{
  char **this_00;
  Name breakTo;
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *pEVar2;
  Literal *pLVar3;
  Literals local_1b0;
  string_view local_178;
  Literals local_168;
  undefined1 local_129;
  size_t local_128;
  char *pcStack_120;
  undefined1 local_110 [8];
  Literal targetRef;
  Flow target;
  undefined1 local_a0 [8];
  Flow flow;
  Literals arguments;
  CallRef *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Flow *ret;
  
  this_00 = &flow.breakTo.super_IString.str._M_str;
  Literals::Literals((Literals *)this_00);
  pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_a0,pEVar2,&curr->operands,(Literals *)this_00);
  bVar1 = Flow::breaking((Flow *)local_a0);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_a0);
  }
  else {
    pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit((Flow *)&targetRef.type,pEVar2,curr->target);
    bVar1 = Flow::breaking((Flow *)&targetRef.type);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&targetRef.type);
    }
    else {
      pLVar3 = Flow::getSingleValue((Flow *)&targetRef.type);
      ::wasm::Literal::Literal((Literal *)local_110,pLVar3);
      bVar1 = wasm::Literal::isNull((Literal *)local_110);
      if (bVar1) {
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                  (this,"null target in call_ref");
      }
      if ((curr->isReturn & 1U) == 0) {
        local_129 = 0;
        local_178 = (string_view)wasm::Literal::getFunc((Literal *)local_110);
        Literals::Literals(&local_1b0,(Literals *)&flow.breakTo.super_IString.str._M_str);
        callFunction(&local_168,this,(Name)local_178,&local_1b0);
        Flow::Flow(__return_storage_ptr__,&local_168);
        Literals::~Literals(&local_168);
        Literals::~Literals(&local_1b0);
        local_129 = 1;
      }
      else {
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str,
                   (Literal *)local_110);
        local_128 = RETURN_CALL_FLOW;
        pcStack_120 = _finalize;
        breakTo.super_IString.str._M_str = _finalize;
        breakTo.super_IString.str._M_len = RETURN_CALL_FLOW;
        Flow::Flow(__return_storage_ptr__,breakTo,(Literals *)&flow.breakTo.super_IString.str._M_str
                  );
      }
      ::wasm::Literal::~Literal((Literal *)local_110);
    }
    Flow::~Flow((Flow *)&targetRef.type);
  }
  Flow::~Flow((Flow *)local_a0);
  Literals::~Literals((Literals *)&flow.breakTo.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCallRef(CallRef* curr) {
    NOTE_ENTER("CallRef");
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    Flow target = self()->visit(curr->target);
    if (target.breaking()) {
      return target;
    }
    auto targetRef = target.getSingleValue();
    if (targetRef.isNull()) {
      trap("null target in call_ref");
    }

    if (curr->isReturn) {
      // Return calls are represented by their arguments followed by a reference
      // to the function to be called.
      arguments.push_back(targetRef);
      return Flow(RETURN_CALL_FLOW, std::move(arguments));
    }

    Flow ret = callFunction(targetRef.getFunc(), arguments);
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "(returned to " << scope->function->name << ")\n";
#endif
    return ret;
  }